

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,NameExpression *name_expression)

{
  NameExpression *this_00;
  Label local_38;
  NameExpression *local_18;
  NameExpression *name_expression_local;
  BlockFormerVisitor *this_local;
  
  local_18 = name_expression;
  name_expression_local = (NameExpression *)this;
  this_00 = (NameExpression *)operator_new(0x28);
  Label::Label(&local_38,&local_18->label_);
  NameExpression::NameExpression(this_00,&local_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_ = (Expression *)this_00;
  Label::~Label(&local_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(NameExpression* name_expression) {
  tos_value_.expression_ = new NameExpression(name_expression->label_);
}